

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::version_parser::parse_prerelease_tag
          (version_parser *this,string *out,
          vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
          *out_identifiers)

{
  bool bVar1;
  ulong uVar2;
  size_t k;
  char *ptr;
  from_chars_result fVar3;
  prerelease_identifier local_b0;
  uint local_84;
  string local_80 [8];
  string identifier;
  string local_50 [8];
  string result;
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  *out_identifiers_local;
  string *out_local;
  version_parser *this_local;
  from_chars_result res;
  
  std::__cxx11::string::string(local_50);
  do {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::push_back((char)local_50);
    }
    std::__cxx11::string::string(local_80);
    fVar3 = parse_prerelease_identifier(this,(string *)local_80);
    this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
    res.super_from_chars_result.ptr._0_4_ = fVar3.super_from_chars_result.ec;
    bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)&this_local);
    if (bVar1) {
      std::__cxx11::string::append(local_50);
      make_prerelease_identifier(&local_b0,this,(string *)local_80);
      std::
      vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
      ::push_back(out_identifiers,&local_b0);
      prerelease_identifier::~prerelease_identifier(&local_b0);
    }
    local_84 = (uint)!bVar1;
    std::__cxx11::string::~string(local_80);
    if (local_84 != 0) goto LAB_001064a6;
    bVar1 = token_stream::advanceIfMatch(this->stream,dot);
  } while (bVar1);
  std::__cxx11::string::operator=((string *)out,local_50);
  token_stream::peek((token *)this->stream,(token_stream *)0x0,k);
  fVar3 = success(ptr);
  this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
  res.super_from_chars_result.ptr._0_4_ = fVar3.super_from_chars_result.ec;
  local_84 = 1;
LAB_001064a6:
  std::__cxx11::string::~string(local_50);
  fVar3.super_from_chars_result.ec = (errc)res.super_from_chars_result.ptr;
  fVar3.super_from_chars_result.ptr = (char *)this_local;
  fVar3.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar3.super_from_chars_result;
}

Assistant:

parse_prerelease_tag(std::string& out, std::vector<detail::prerelease_identifier>& out_identifiers) {
    std::string result;

    do {
      if (!result.empty()) {
        result.push_back('.');
      }

      std::string identifier;
      if (const auto res = parse_prerelease_identifier(identifier); !res) {
        return res;
      }

      result.append(identifier);
      out_identifiers.push_back(make_prerelease_identifier(identifier));

    } while (stream.advanceIfMatch(token_type::dot));

    out = result;
    return success(stream.peek().lexeme);
  }